

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O1

Abc_Obj_t * Abc_NtkBddFindCofactor(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNode,int nLutSize)

{
  DdManager *dd;
  DdManager *ddDestination;
  bool bVar1;
  int iVar2;
  uint uVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  int *piVar7;
  DdNode *pDVar8;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  int iVar9;
  uint i;
  uint i_00;
  ulong uVar10;
  Abc_Obj_t *pFanin;
  int *piVar11;
  long lVar12;
  
  if ((pNode->vFanins).nSize != nLutSize + 1) {
    __assert_fail("Abc_ObjFaninNum(pNode) == nLutSize + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLutmin.c"
                  ,0x1fd,"Abc_Obj_t *Abc_NtkBddFindCofactor(Abc_Ntk_t *, Abc_Obj_t *, int)");
  }
  dd = (DdManager *)pNode->pNtk->pManFunc;
  ddDestination = (DdManager *)pNtkNew->pManFunc;
  if ((pNode->vFanins).nSize < 1) {
    i_00 = 0;
    pDVar4 = (DdNode *)0x0;
    pDVar5 = (DdNode *)0x0;
    bVar1 = false;
  }
  else {
    iVar9 = nLutSize + -2;
    i_00 = 0;
    do {
      pDVar4 = Cudd_bddIthVar(dd,i_00);
      pDVar5 = Cudd_Cofactor(dd,(DdNode *)(pNode->field_5).pData,(DdNode *)((ulong)pDVar4 ^ 1));
      Cudd_Ref(pDVar5);
      pDVar4 = Cudd_Cofactor(dd,(DdNode *)(pNode->field_5).pData,pDVar4);
      Cudd_Ref(pDVar4);
      iVar2 = Cudd_SupportSize(dd,pDVar5);
      bVar1 = iVar2 <= iVar9;
      if ((iVar2 <= iVar9) || (iVar2 = Cudd_SupportSize(dd,pDVar4), iVar2 <= iVar9)) break;
      Cudd_RecursiveDeref(dd,pDVar5);
      Cudd_RecursiveDeref(dd,pDVar4);
      i_00 = i_00 + 1;
    } while ((int)i_00 < (pNode->vFanins).nSize);
  }
  if (i_00 == (pNode->vFanins).nSize) {
    pObj_00 = (Abc_Obj_t *)0x0;
  }
  else {
    pDVar6 = pDVar4;
    if (bVar1) {
      pDVar6 = pDVar5;
    }
    pDVar6 = Cudd_Support(dd,pDVar6);
    Cudd_Ref(pDVar6);
    i = 0xffffffff;
    if (0 < (pNode->vFanins).nSize) {
      piVar7 = (int *)((ulong)pDVar6 & 0xfffffffffffffffe);
      i = 0;
      do {
        uVar3 = Cudd_ReadPerm(dd,i);
        if (i != uVar3) {
          __assert_fail("i == Cudd_ReadPerm(ddOld, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLutmin.c"
                        ,0x217,"Abc_Obj_t *Abc_NtkBddFindCofactor(Abc_Ntk_t *, Abc_Obj_t *, int)");
        }
        if (i != i_00) {
          piVar11 = piVar7;
          if (*piVar7 != 0x7fffffff) {
            uVar3 = Cudd_NodeReadIndex(pDVar6);
            pDVar8 = pDVar6;
            while (i != uVar3) {
              pDVar8 = (pDVar8->type).kids.T;
              piVar11 = (int *)((ulong)pDVar8 & 0xfffffffffffffffe);
              if (*piVar11 == 0x7fffffff) break;
              uVar3 = Cudd_NodeReadIndex(pDVar8);
            }
          }
          if (*piVar11 == 0x7fffffff) goto LAB_002d9078;
        }
        i = i + 1;
      } while ((int)i < (pNode->vFanins).nSize);
      i = 0xffffffff;
    }
LAB_002d9078:
    if ((i == i_00) || ((pNode->vFanins).nSize <= (int)i)) {
      __assert_fail("iFreeVar != iCof && iFreeVar < Abc_ObjFaninNum(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLutmin.c"
                    ,0x223,"Abc_Obj_t *Abc_NtkBddFindCofactor(Abc_Ntk_t *, Abc_Obj_t *, int)");
    }
    Cudd_RecursiveDeref(dd,pDVar6);
    pDVar8 = Extra_TransferLevelByLevel(dd,ddDestination,pDVar5);
    Cudd_Ref(pDVar8);
    pDVar6 = Extra_TransferLevelByLevel(dd,ddDestination,pDVar4);
    Cudd_Ref(pDVar6);
    Cudd_RecursiveDeref(dd,pDVar5);
    Cudd_RecursiveDeref(dd,pDVar4);
    pObj = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
    if (0 < (pNode->vFanins).nSize) {
      lVar12 = 0;
      do {
        Abc_ObjAddFanin(pObj,*(Abc_Obj_t **)
                              ((long)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar12]] +
                              0x40));
        lVar12 = lVar12 + 1;
      } while (lVar12 < (pNode->vFanins).nSize);
    }
    pDVar5 = pDVar8;
    if (bVar1) {
      pDVar5 = pDVar6;
    }
    (pObj->field_5).pData = pDVar5;
    pObj_00 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
    if (0 < (pNode->vFanins).nSize) {
      uVar10 = 0;
      do {
        pFanin = pObj;
        if (i != uVar10) {
          pFanin = *(Abc_Obj_t **)
                    ((long)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[uVar10]] + 0x40);
        }
        Abc_ObjAddFanin(pObj_00,pFanin);
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 < (long)(pNode->vFanins).nSize);
    }
    pDVar5 = Cudd_bddIthVar(ddDestination,i_00);
    if (bVar1) {
      pDVar4 = Cudd_bddIthVar(ddDestination,i);
      pDVar6 = pDVar8;
    }
    else {
      pDVar8 = Cudd_bddIthVar(ddDestination,i);
      pDVar4 = pDVar6;
    }
    pDVar5 = Cudd_bddIte(ddDestination,pDVar5,pDVar4,pDVar8);
    (pObj_00->field_5).pData = pDVar5;
    Cudd_Ref(pDVar5);
    Cudd_RecursiveDeref(ddDestination,pDVar6);
  }
  return pObj_00;
}

Assistant:

Abc_Obj_t * Abc_NtkBddFindCofactor( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNode, int nLutSize )
{
    Abc_Obj_t * pNodeBot, * pNodeTop;
    DdManager * ddOld = (DdManager *)pNode->pNtk->pManFunc;
    DdManager * ddNew = (DdManager *)pNtkNew->pManFunc;
    DdNode * bCof0 = NULL, * bCof1 = NULL, * bSupp, * bTemp, * bVar;
    DdNode * bCof0n, * bCof1n;
    int i, iCof, iFreeVar, fCof1Smaller = -1;
    assert( Abc_ObjFaninNum(pNode) == nLutSize + 1 );
    for ( iCof = 0; iCof < Abc_ObjFaninNum(pNode); iCof++ )
    {
        bVar  = Cudd_bddIthVar( ddOld, iCof );
        bCof0 = Cudd_Cofactor( ddOld, (DdNode *)pNode->pData, Cudd_Not(bVar) );  Cudd_Ref( bCof0 );
        bCof1 = Cudd_Cofactor( ddOld, (DdNode *)pNode->pData, bVar  );           Cudd_Ref( bCof1 );
        if ( Cudd_SupportSize( ddOld, bCof0 ) <= nLutSize - 2 )
        {
            fCof1Smaller = 0;
            break;
        }
        if ( Cudd_SupportSize( ddOld, bCof1 ) <= nLutSize - 2 )
        {
            fCof1Smaller = 1;
            break;
        }
        Cudd_RecursiveDeref( ddOld, bCof0 );
        Cudd_RecursiveDeref( ddOld, bCof1 );
    }
    if ( iCof == Abc_ObjFaninNum(pNode) )
        return NULL;
    // find unused variable
    bSupp = Cudd_Support( ddOld, fCof1Smaller? bCof1 : bCof0 );   Cudd_Ref( bSupp );
    iFreeVar = -1;
    for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
    {
        assert( i == Cudd_ReadPerm(ddOld, i) );
        if ( i == iCof )
            continue;
        for ( bTemp = bSupp; !Cudd_IsConstant(bTemp); bTemp = cuddT(bTemp) )
            if ( i == (int)Cudd_NodeReadIndex(bTemp) )
                break;
        if ( Cudd_IsConstant(bTemp) )
        {
            iFreeVar = i;
            break;
        }
    }
    assert( iFreeVar != iCof && iFreeVar < Abc_ObjFaninNum(pNode) );
    Cudd_RecursiveDeref( ddOld, bSupp );
    // transfer the cofactors
    bCof0n = Extra_TransferLevelByLevel( ddOld, ddNew, bCof0 ); Cudd_Ref( bCof0n );
    bCof1n = Extra_TransferLevelByLevel( ddOld, ddNew, bCof1 ); Cudd_Ref( bCof1n );
    Cudd_RecursiveDeref( ddOld, bCof0 );
    Cudd_RecursiveDeref( ddOld, bCof1 );
    // create bottom node
    pNodeBot = Abc_NtkCreateNode( pNtkNew );
    for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
        Abc_ObjAddFanin( pNodeBot, Abc_ObjFanin(pNode, i)->pCopy );
    pNodeBot->pData = fCof1Smaller? bCof0n : bCof1n;
    // create top node
    pNodeTop = Abc_NtkCreateNode( pNtkNew );
    for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
        if ( i == iFreeVar )           
            Abc_ObjAddFanin( pNodeTop, pNodeBot );
        else
            Abc_ObjAddFanin( pNodeTop, Abc_ObjFanin(pNode, i)->pCopy );
    // derive the new function
    pNodeTop->pData = Cudd_bddIte( ddNew, 
        Cudd_bddIthVar(ddNew, iCof), 
        fCof1Smaller? bCof1n : Cudd_bddIthVar(ddNew, iFreeVar), 
        fCof1Smaller? Cudd_bddIthVar(ddNew, iFreeVar) : bCof0n );
    Cudd_Ref( (DdNode *)pNodeTop->pData );
    Cudd_RecursiveDeref( ddNew, fCof1Smaller? bCof1n : bCof0n );
    return pNodeTop;
}